

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O3

NextTask * __thiscall
dd::TaskQueueStdlib::GetNextTask(NextTask *__return_storage_ptr__,TaskQueueStdlib *this)

{
  const_iterator __position;
  _Map_pointer pppVar1;
  QueuedTask *pQVar2;
  _Base_ptr p_Var3;
  long lVar4;
  value_type *entry;
  long lVar5;
  _Elt_pointer ppVar6;
  
  __return_storage_ptr__->_final_task = false;
  (__return_storage_ptr__->_run_task)._M_t.
  super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
  super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
  super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)0x0;
  __return_storage_ptr__->_sleep_time_ms = 0;
  lVar4 = std::chrono::_V2::system_clock::now();
  pthread_mutex_lock((pthread_mutex_t *)&this->_pending_lock);
  if (this->_thread_should_quit == true) {
    __return_storage_ptr__->_final_task = true;
    goto LAB_00123f7f;
  }
  if ((this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00123e94:
    pppVar1 = (this->_pending_queue).c.
              super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar6 = (this->_pending_queue).c.
             super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((long)(this->_pending_queue).c.
               super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar6 >> 4) +
        ((long)(this->_pending_queue).c.
               super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->_pending_queue).c.
               super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
        ((((ulong)((long)pppVar1 -
                  (long)(this->_pending_queue).c.
                        super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(pppVar1 == (_Map_pointer)0x0)) * 0x20 == 0) goto LAB_00123f7f;
  }
  else {
    __position._M_node = (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    lVar5 = *(long *)(__position._M_node + 1) - lVar4 / 1000000;
    if (lVar5 != 0 && lVar4 / 1000000 <= *(long *)(__position._M_node + 1)) {
      __return_storage_ptr__->_sleep_time_ms = lVar5;
      goto LAB_00123e94;
    }
    pppVar1 = (this->_pending_queue).c.
              super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar6 = (this->_pending_queue).c.
             super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((((long)(this->_pending_queue).c.
                super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar6 >> 4) +
         ((long)(this->_pending_queue).c.
                super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
          (long)(this->_pending_queue).c.
                super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
         ((((ulong)((long)pppVar1 -
                   (long)(this->_pending_queue).c.
                         super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (ulong)(pppVar1 == (_Map_pointer)0x0)) * 0x20 == 0) ||
       (__position._M_node[1]._M_parent <= (_Base_ptr)ppVar6->first)) {
      p_Var3 = __position._M_node[1]._M_left;
      __position._M_node[1]._M_left = (_Base_ptr)0x0;
      (__return_storage_ptr__->_run_task)._M_t.
      super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
      super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
      super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)p_Var3;
      std::
      _Rb_tree<dd::TaskQueueStdlib::DelayedEntryTimeout,_std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::_Select1st<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>,_std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,_std::allocator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
      ::_M_erase_aux(&(this->_delayed_queue)._M_t,__position);
      goto LAB_00123f7f;
    }
  }
  pQVar2 = (ppVar6->second)._M_t.
           super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
           super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
           super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl;
  (ppVar6->second)._M_t.super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>.
  _M_t.super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
  super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)0x0;
  (__return_storage_ptr__->_run_task)._M_t.
  super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
  super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
  super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = pQVar2;
  std::
  deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ::pop_front(&(this->_pending_queue).c);
LAB_00123f7f:
  pthread_mutex_unlock((pthread_mutex_t *)&this->_pending_lock);
  return __return_storage_ptr__;
}

Assistant:

dd::TaskQueueStdlib::NextTask TaskQueueStdlib::GetNextTask()
	{
		NextTask result{};
		auto tick = GetCurrentTick();
		AutoLock lock(_pending_lock);
		if (_thread_should_quit) {
			result._final_task = true;
			return result;
		}

		if (_delayed_queue.size() > 0) {
			auto delayed_entry = _delayed_queue.begin();
			const auto& delay_info = delayed_entry->first;
			auto& delay_run = delayed_entry->second;
			if (tick >= delay_info._next_fire_at_ms) {
				if (_pending_queue.size() > 0) {
					auto& entry = _pending_queue.front();
					auto& entry_order = entry.first;
					auto& entry_run = entry.second;
					if (entry_order < delay_info._order){
						result._run_task = std::move(entry_run);
						_pending_queue.pop();
						return result;
					}
				}

				result._run_task = std::move(delay_run);
				_delayed_queue.erase(delayed_entry);
				return result;
			}
			result._sleep_time_ms = delay_info._next_fire_at_ms - tick;
		}

		if (_pending_queue.size() > 0) {
			auto& entry = _pending_queue.front();
			result._run_task = std::move(entry.second);
			_pending_queue.pop();
		}
		return result;
	}